

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::TPZCompElHCurl
          (TPZCompElHCurl<pzshape::TPZShapeCube> *this,TPZCompMesh *mesh,
          TPZCompElHCurl<pzshape::TPZShapeCube> *copy)

{
  long in_RDX;
  TPZRegisterClassId *in_RDI;
  TPZIntelGen<pzshape::TPZShapeCube> *in_stack_ffffffffffffffc8;
  TPZCompMesh *in_stack_ffffffffffffffd0;
  void **vtt;
  TPZManVector<long,_19> *this_00;
  
  this_00 = (TPZManVector<long,_19> *)0x0;
  vtt = (void **)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElHCurl<pzshape::TPZShapeCube>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02509968);
  TPZIntelGen<pzshape::TPZShapeCube>::TPZIntelGen
            ((TPZIntelGen<pzshape::TPZShapeCube> *)this_00,vtt,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  *(undefined ***)in_RDI = &PTR__TPZCompElHCurl_02509550;
  *(undefined ***)in_RDI = &PTR__TPZCompElHCurl_02509550;
  TPZManVector<long,_19>::TPZManVector(this_00,(int64_t)vtt,(long *)in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(in_RDX + 0x118);
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::TPZCompElHCurl(TPZCompMesh &mesh, const TPZCompElHCurl<TSHAPE> &copy) :
TPZRegisterClassId(&TPZCompElHCurl::ClassId),
TPZIntelGen<TSHAPE>(mesh,copy), fhcurlfam(copy.fhcurlfam)
{

}